

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::TriangleMiIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  vfloat<4> vVar2;
  float *pfVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined8 uVar13;
  undefined8 uVar14;
  vbool<4> vVar15;
  uint uVar16;
  int iVar17;
  float *vertices;
  undefined4 uVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  NodeRef root;
  size_t sVar22;
  size_t sVar23;
  uint uVar24;
  ulong uVar25;
  NodeRef *pNVar26;
  ulong uVar27;
  ulong uVar28;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar29;
  bool bVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 in_ZMM0 [64];
  vint4 ai_2;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [64];
  float fVar40;
  float fVar47;
  float fVar48;
  vint4 ai;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar49;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  vint4 bi_3;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  vint4 bi_2;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  vint4 bi_1;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  vint4 ai_1;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  vint4 ai_3;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  vint4 bi;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  uint uVar80;
  uint uVar81;
  uint uVar82;
  undefined1 auVar79 [64];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [64];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  Precalculations pre;
  vbool<4> terminated;
  undefined1 local_19a8 [16];
  BVH *local_1998;
  Intersectors *local_1990;
  Scene *local_1988;
  vuint<4> *v;
  RTCFilterFunctionNArguments args;
  undefined1 local_1928 [16];
  undefined1 local_1918 [16];
  undefined1 local_1908 [16];
  undefined1 local_18f8 [16];
  undefined1 local_18e8 [8];
  float fStack_18e0;
  float fStack_18dc;
  undefined1 local_18d8 [8];
  float fStack_18d0;
  float fStack_18cc;
  undefined1 local_18c8 [8];
  float fStack_18c0;
  float fStack_18bc;
  longlong local_1898;
  longlong lStack_1890;
  longlong local_1888;
  longlong lStack_1880;
  TravRayK<4,_false> tray;
  undefined8 local_1768;
  undefined8 uStack_1760;
  undefined8 local_1758;
  undefined8 uStack_1750;
  undefined1 local_1748 [16];
  undefined1 local_1738 [16];
  float local_1728;
  float fStack_1724;
  float fStack_1720;
  float fStack_171c;
  undefined1 local_1718 [16];
  uint local_1708;
  uint uStack_1704;
  uint uStack_1700;
  uint uStack_16fc;
  uint local_16f8;
  uint uStack_16f4;
  uint uStack_16f0;
  uint uStack_16ec;
  uint uStack_16e8;
  uint uStack_16e4;
  uint uStack_16e0;
  uint uStack_16dc;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  uVar14 = mm_lookupmask_ps._8_8_;
  uVar13 = mm_lookupmask_ps._0_8_;
  local_1998 = (BVH *)This->ptr;
  stack_node[1].ptr = (local_1998->root).ptr;
  if (stack_node[1].ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar34 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar37 = vpcmpeqd_avx(auVar34,(undefined1  [16])valid_i->field_0);
    auVar41 = ZEXT816(0) << 0x40;
    auVar7 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar41,5);
    auVar33 = auVar37 & auVar7;
    if ((((auVar33 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar33 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar33 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar33[0xf] < '\0')
    {
      auVar7 = vandps_avx(auVar7,auVar37);
      tray.org.field_0._0_4_ = *(float *)ray;
      tray.org.field_0._4_4_ = *(float *)(ray + 4);
      tray.org.field_0._8_4_ = *(float *)(ray + 8);
      tray.org.field_0._12_4_ = *(float *)(ray + 0xc);
      tray.org.field_0._16_4_ = *(float *)(ray + 0x10);
      tray.org.field_0._20_4_ = *(float *)(ray + 0x14);
      tray.org.field_0._24_4_ = *(float *)(ray + 0x18);
      tray.org.field_0._28_4_ = *(float *)(ray + 0x1c);
      tray.org.field_0._32_4_ = *(float *)(ray + 0x20);
      tray.org.field_0._36_4_ = *(float *)(ray + 0x24);
      tray.org.field_0._40_4_ = *(float *)(ray + 0x28);
      tray.org.field_0._44_4_ = *(float *)(ray + 0x2c);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar83._8_4_ = 0x7fffffff;
      auVar83._0_8_ = 0x7fffffff7fffffff;
      auVar83._12_4_ = 0x7fffffff;
      auVar37 = vandps_avx(auVar83,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar72._8_4_ = 0x219392ef;
      auVar72._0_8_ = 0x219392ef219392ef;
      auVar72._12_4_ = 0x219392ef;
      auVar37 = vcmpps_avx(auVar37,auVar72,1);
      auVar33 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar72,auVar37);
      auVar37 = vandps_avx(auVar83,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar37 = vcmpps_avx(auVar37,auVar72,1);
      auVar55 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar72,auVar37);
      auVar37 = vandps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar83);
      auVar37 = vcmpps_avx(auVar37,auVar72,1);
      auVar37 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar72,auVar37);
      auVar58 = vrcpps_avx(auVar33);
      auVar73._8_4_ = 0x3f800000;
      auVar73._0_8_ = 0x3f8000003f800000;
      auVar73._12_4_ = 0x3f800000;
      auVar33 = vfnmadd213ps_fma(auVar33,auVar58,auVar73);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar33,auVar58,auVar58)
      ;
      auVar33 = vrcpps_avx(auVar55);
      auVar55 = vfnmadd213ps_fma(auVar55,auVar33,auVar73);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar55,auVar33,auVar33)
      ;
      auVar33 = vrcpps_avx(auVar37);
      auVar37 = vfnmadd213ps_fma(auVar37,auVar33,auVar73);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar37,auVar33,auVar33)
      ;
      tray.org_rdir.field_0._0_4_ = tray.rdir.field_0._0_4_ * *(float *)ray;
      tray.org_rdir.field_0._4_4_ = tray.rdir.field_0._4_4_ * *(float *)(ray + 4);
      tray.org_rdir.field_0._8_4_ = tray.rdir.field_0._8_4_ * *(float *)(ray + 8);
      tray.org_rdir.field_0._12_4_ = tray.rdir.field_0._12_4_ * *(float *)(ray + 0xc);
      tray.org_rdir.field_0._16_4_ = *(float *)(ray + 0x10) * tray.rdir.field_0._16_4_;
      tray.org_rdir.field_0._20_4_ = *(float *)(ray + 0x14) * tray.rdir.field_0._20_4_;
      tray.org_rdir.field_0._24_4_ = *(float *)(ray + 0x18) * tray.rdir.field_0._24_4_;
      tray.org_rdir.field_0._28_4_ = *(float *)(ray + 0x1c) * tray.rdir.field_0._28_4_;
      tray.org_rdir.field_0._32_4_ = *(float *)(ray + 0x20) * tray.rdir.field_0._32_4_;
      tray.org_rdir.field_0._36_4_ = *(float *)(ray + 0x24) * tray.rdir.field_0._36_4_;
      tray.org_rdir.field_0._40_4_ = *(float *)(ray + 0x28) * tray.rdir.field_0._40_4_;
      tray.org_rdir.field_0._44_4_ = *(float *)(ray + 0x2c) * tray.rdir.field_0._44_4_;
      auVar37 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar41,1);
      auVar33._8_4_ = 0x10;
      auVar33._0_8_ = 0x1000000010;
      auVar33._12_4_ = 0x10;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar37,auVar33);
      auVar37 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar41,5);
      auVar55._8_4_ = 0x20;
      auVar55._0_8_ = 0x2000000020;
      auVar55._12_4_ = 0x20;
      auVar58._8_4_ = 0x30;
      auVar58._0_8_ = 0x3000000030;
      auVar58._12_4_ = 0x30;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar58,auVar55,auVar37);
      auVar37 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar41,5);
      auVar59._8_4_ = 0x40;
      auVar59._0_8_ = 0x4000000040;
      auVar59._12_4_ = 0x40;
      auVar63._8_4_ = 0x50;
      auVar63._0_8_ = 0x5000000050;
      auVar63._12_4_ = 0x50;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar63,auVar59,auVar37);
      auVar37 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar41);
      auVar33 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar41);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar85 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar37,auVar7);
      auVar37._8_4_ = 0xff800000;
      auVar37._0_8_ = 0xff800000ff800000;
      auVar37._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar37,auVar33,auVar7);
      terminated.field_0.i[1] = auVar7._4_4_ ^ auVar34._4_4_;
      terminated.field_0.i[0] = auVar7._0_4_ ^ auVar34._0_4_;
      terminated.field_0.i[2] = auVar7._8_4_ ^ auVar34._8_4_;
      terminated.field_0.i[3] = auVar7._12_4_ ^ auVar34._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar24 = 3;
      }
      else {
        uVar24 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pRVar1 = ray + 0x80;
      pNVar26 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar29 = &stack_near[2].field_0;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar34 = vpcmpeqd_avx(auVar7,auVar7);
      auVar79 = ZEXT1664(auVar34);
      local_1990 = This;
LAB_019bf5b3:
      do {
        do {
          root.ptr = pNVar26[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_019bff18;
          pNVar26 = pNVar26 + -1;
          paVar29 = paVar29 + -1;
          vVar2.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar29->v;
          auVar39 = ZEXT1664((undefined1  [16])vVar2.field_0);
          auVar34 = vcmpps_avx((undefined1  [16])vVar2.field_0,(undefined1  [16])tray.tfar.field_0,1
                              );
          uVar16 = vmovmskps_avx(auVar34);
        } while (uVar16 == 0);
        uVar28 = (ulong)(uVar16 & 0xff);
        uVar16 = POPCOUNT(uVar16 & 0xff);
        if (uVar24 < uVar16) {
LAB_019bf5f3:
          do {
            vVar15.field_0 = terminated.field_0;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_019bff18;
              auVar34 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar39._0_16_,6);
              if ((((auVar34 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar34 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar34 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar34[0xf]) goto LAB_019bf5b3;
              uVar28 = (ulong)((uint)root.ptr & 0xf);
              if (uVar28 == 8) goto LAB_019bfe1c;
              auVar41._0_4_ = auVar79._0_4_ ^ terminated.field_0._0_4_;
              auVar41._4_4_ = auVar79._4_4_ ^ terminated.field_0._4_4_;
              auVar41._8_4_ = auVar79._8_4_ ^ terminated.field_0._8_4_;
              auVar41._12_4_ = auVar79._12_4_ ^ terminated.field_0._12_4_;
              lVar20 = (root.ptr & 0xfffffffffffffff0) + 0x40;
              uVar25 = 0;
              goto LAB_019bf7d5;
            }
            lVar20 = 0;
            sVar23 = 8;
            auVar34 = auVar85._0_16_;
            do {
              sVar22 = *(size_t *)((root.ptr & 0xfffffffffffffff0) + lVar20 * 8);
              if (sVar22 == 8) {
                auVar39 = ZEXT1664(auVar34);
                sVar22 = sVar23;
                break;
              }
              uVar18 = *(undefined4 *)(root.ptr + 0x20 + lVar20 * 4);
              auVar42._4_4_ = uVar18;
              auVar42._0_4_ = uVar18;
              auVar42._8_4_ = uVar18;
              auVar42._12_4_ = uVar18;
              auVar10._4_4_ = tray.org_rdir.field_0._4_4_;
              auVar10._0_4_ = tray.org_rdir.field_0._0_4_;
              auVar10._8_4_ = tray.org_rdir.field_0._8_4_;
              auVar10._12_4_ = tray.org_rdir.field_0._12_4_;
              auVar41 = vfmsub213ps_fma(auVar42,(undefined1  [16])
                                                tray.rdir.field_0.field_0.x.field_0,auVar10);
              uVar18 = *(undefined4 *)(root.ptr + 0x40 + lVar20 * 4);
              auVar64._4_4_ = uVar18;
              auVar64._0_4_ = uVar18;
              auVar64._8_4_ = uVar18;
              auVar64._12_4_ = uVar18;
              auVar11._4_4_ = tray.org_rdir.field_0._20_4_;
              auVar11._0_4_ = tray.org_rdir.field_0._16_4_;
              auVar11._8_4_ = tray.org_rdir.field_0._24_4_;
              auVar11._12_4_ = tray.org_rdir.field_0._28_4_;
              auVar55 = vfmsub213ps_fma(auVar64,(undefined1  [16])
                                                tray.rdir.field_0.field_0.y.field_0,auVar11);
              uVar18 = *(undefined4 *)(root.ptr + 0x60 + lVar20 * 4);
              auVar67._4_4_ = uVar18;
              auVar67._0_4_ = uVar18;
              auVar67._8_4_ = uVar18;
              auVar67._12_4_ = uVar18;
              auVar12._4_4_ = tray.org_rdir.field_0._36_4_;
              auVar12._0_4_ = tray.org_rdir.field_0._32_4_;
              auVar12._8_4_ = tray.org_rdir.field_0._40_4_;
              auVar12._12_4_ = tray.org_rdir.field_0._44_4_;
              auVar58 = vfmsub213ps_fma(auVar67,(undefined1  [16])
                                                tray.rdir.field_0.field_0.z.field_0,auVar12);
              uVar18 = *(undefined4 *)(root.ptr + 0x30 + lVar20 * 4);
              auVar74._4_4_ = uVar18;
              auVar74._0_4_ = uVar18;
              auVar74._8_4_ = uVar18;
              auVar74._12_4_ = uVar18;
              auVar59 = vfmsub213ps_fma(auVar74,(undefined1  [16])
                                                tray.rdir.field_0.field_0.x.field_0,auVar10);
              uVar18 = *(undefined4 *)(root.ptr + 0x50 + lVar20 * 4);
              auVar60._4_4_ = uVar18;
              auVar60._0_4_ = uVar18;
              auVar60._8_4_ = uVar18;
              auVar60._12_4_ = uVar18;
              auVar63 = vfmsub213ps_fma(auVar60,(undefined1  [16])
                                                tray.rdir.field_0.field_0.y.field_0,auVar11);
              uVar18 = *(undefined4 *)(root.ptr + 0x70 + lVar20 * 4);
              auVar50._4_4_ = uVar18;
              auVar50._0_4_ = uVar18;
              auVar50._8_4_ = uVar18;
              auVar50._12_4_ = uVar18;
              auVar72 = vfmsub213ps_fma(auVar50,(undefined1  [16])
                                                tray.rdir.field_0.field_0.z.field_0,auVar12);
              auVar37 = vpminsd_avx(auVar41,auVar59);
              auVar33 = vpminsd_avx(auVar55,auVar63);
              auVar37 = vpmaxsd_avx(auVar37,auVar33);
              auVar33 = vpminsd_avx(auVar58,auVar72);
              auVar33 = vpmaxsd_avx(auVar37,auVar33);
              auVar37 = vpmaxsd_avx(auVar41,auVar59);
              auVar41 = vpmaxsd_avx(auVar55,auVar63);
              auVar41 = vpminsd_avx(auVar37,auVar41);
              auVar37 = vpmaxsd_avx(auVar58,auVar72);
              auVar41 = vpminsd_avx(auVar41,auVar37);
              auVar37 = vpmaxsd_avx(auVar33,(undefined1  [16])tray.tnear.field_0);
              auVar41 = vpminsd_avx(auVar41,(undefined1  [16])tray.tfar.field_0);
              auVar37 = vcmpps_avx(auVar37,auVar41,2);
              if ((((auVar37 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar37 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar37 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar37[0xf]) {
                auVar39 = ZEXT1664(auVar34);
                sVar22 = sVar23;
              }
              else {
                auVar37 = vblendvps_avx(auVar85._0_16_,auVar33,auVar37);
                auVar39 = ZEXT1664(auVar37);
                if (sVar23 != 8) {
                  pNVar26->ptr = sVar23;
                  pNVar26 = pNVar26 + 1;
                  *(undefined1 (*) [16])paVar29->v = auVar34;
                  paVar29 = paVar29 + 1;
                }
              }
              lVar20 = lVar20 + 1;
              auVar34 = auVar39._0_16_;
              sVar23 = sVar22;
            } while (lVar20 != 4);
            iVar17 = 4;
            if (sVar22 == 8) goto LAB_019bf76e;
            auVar34 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,
                                 (undefined1  [16])auVar39._0_16_,6);
            uVar18 = vmovmskps_avx(auVar34);
            root.ptr = sVar22;
          } while ((byte)uVar24 < (byte)POPCOUNT(uVar18));
          pNVar26->ptr = sVar22;
          pNVar26 = pNVar26 + 1;
          *paVar29 = auVar39._0_16_;
          paVar29 = paVar29 + 1;
        }
        else {
          do {
            sVar23 = 0;
            for (uVar25 = uVar28; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
              sVar23 = sVar23 + 1;
            }
            auVar79 = ZEXT1664(auVar79._0_16_);
            bVar30 = occluded1(local_1990,local_1998,root,sVar23,&pre,ray,&tray,context);
            if (bVar30) {
              terminated.field_0.i[sVar23] = -1;
            }
            uVar28 = uVar28 - 1 & uVar28;
          } while (uVar28 != 0);
          auVar34 = vpcmpeqd_avx(auVar79._0_16_,auVar79._0_16_);
          auVar79 = ZEXT1664(auVar34);
          auVar34 = auVar34 & ~(undefined1  [16])terminated.field_0;
          if ((((auVar34 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar34 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar34 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar34[0xf]) {
            iVar17 = 3;
          }
          else {
            auVar34._8_4_ = 0xff800000;
            auVar34._0_8_ = 0xff800000ff800000;
            auVar34._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar34,
                               (undefined1  [16])terminated.field_0);
            iVar17 = 2;
          }
          auVar85 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar39 = ZEXT1664((undefined1  [16])vVar2.field_0);
          if (uVar24 < uVar16) goto LAB_019bf5f3;
        }
LAB_019bf76e:
      } while ((iVar17 == 4) || (iVar17 == 2));
LAB_019bff18:
      auVar7 = vandps_avx(auVar7,(undefined1  [16])terminated.field_0);
      auVar38._8_4_ = 0xff800000;
      auVar38._0_8_ = 0xff800000ff800000;
      auVar38._12_4_ = 0xff800000;
      auVar7 = vmaskmovps_avx(auVar7,auVar38);
      *(undefined1 (*) [16])pRVar1 = auVar7;
    }
  }
  return;
  while( true ) {
    uVar25 = uVar25 + 1;
    lVar20 = lVar20 + 0x50;
    auVar41 = auVar37;
    if (uVar28 - 8 <= uVar25) break;
LAB_019bf7d5:
    v = (vuint<4> *)(uVar25 * 0x50 + (root.ptr & 0xfffffffffffffff0));
    local_1988 = context->scene;
    uVar27 = 0;
    auVar34 = auVar41;
    while (*(int *)(lVar20 + uVar27 * 4) != -1) {
      pfVar3 = (local_1988->vertices).items[*(uint *)(lVar20 + -0x10 + uVar27 * 4)];
      uVar19 = (ulong)*(uint *)(lVar20 + -0x40 + uVar27 * 4);
      uVar21 = (ulong)*(uint *)(lVar20 + -0x30 + uVar27 * 4);
      fVar40 = pfVar3[uVar19];
      auVar56._4_4_ = fVar40;
      auVar56._0_4_ = fVar40;
      auVar56._8_4_ = fVar40;
      auVar56._12_4_ = fVar40;
      fVar47 = pfVar3[uVar19 + 1];
      auVar65._4_4_ = fVar47;
      auVar65._0_4_ = fVar47;
      auVar65._8_4_ = fVar47;
      auVar65._12_4_ = fVar47;
      fVar48 = pfVar3[uVar19 + 2];
      auVar68._4_4_ = fVar48;
      auVar68._0_4_ = fVar48;
      auVar68._8_4_ = fVar48;
      auVar68._12_4_ = fVar48;
      uVar19 = (ulong)*(uint *)(lVar20 + -0x20 + uVar27 * 4);
      fVar8 = fVar40 - pfVar3[uVar21];
      fVar49 = fVar47 - pfVar3[uVar21 + 1];
      fVar9 = fVar48 - pfVar3[uVar21 + 2];
      local_1888 = v[3].field_0.v[0];
      lStack_1880 = v[3].field_0.v[1];
      local_1898 = v[4].field_0.v[0];
      lStack_1890 = v[4].field_0.v[1];
      auVar51._4_4_ = fVar8;
      auVar51._0_4_ = fVar8;
      auVar51._8_4_ = fVar8;
      auVar51._12_4_ = fVar8;
      auVar61._4_4_ = fVar49;
      auVar61._0_4_ = fVar49;
      auVar61._8_4_ = fVar49;
      auVar61._12_4_ = fVar49;
      auVar35._4_4_ = fVar9;
      auVar35._0_4_ = fVar9;
      auVar35._8_4_ = fVar9;
      auVar35._12_4_ = fVar9;
      fVar40 = pfVar3[uVar19] - fVar40;
      auVar75._4_4_ = fVar40;
      auVar75._0_4_ = fVar40;
      auVar75._8_4_ = fVar40;
      auVar75._12_4_ = fVar40;
      fVar47 = pfVar3[uVar19 + 1] - fVar47;
      auVar77._4_4_ = fVar47;
      auVar77._0_4_ = fVar47;
      auVar77._8_4_ = fVar47;
      auVar77._12_4_ = fVar47;
      fVar48 = pfVar3[uVar19 + 2] - fVar48;
      auVar84._4_4_ = fVar48;
      auVar84._0_4_ = fVar48;
      auVar84._8_4_ = fVar48;
      auVar84._12_4_ = fVar48;
      fVar49 = fVar49 * fVar48;
      auVar31._4_4_ = fVar49;
      auVar31._0_4_ = fVar49;
      auVar31._8_4_ = fVar49;
      auVar31._12_4_ = fVar49;
      auVar73 = vfmsub231ps_fma(auVar31,auVar77,auVar35);
      fVar40 = fVar9 * fVar40;
      auVar36._4_4_ = fVar40;
      auVar36._0_4_ = fVar40;
      auVar36._8_4_ = fVar40;
      auVar36._12_4_ = fVar40;
      auVar31 = vfmsub231ps_fma(auVar36,auVar84,auVar51);
      fVar47 = fVar47 * fVar8;
      auVar43._4_4_ = fVar47;
      auVar43._0_4_ = fVar47;
      auVar43._8_4_ = fVar47;
      auVar43._12_4_ = fVar47;
      auVar58 = vsubps_avx(auVar56,*(undefined1 (*) [16])ray);
      auVar59 = vsubps_avx(auVar65,*(undefined1 (*) [16])(ray + 0x10));
      auVar35 = vfmsub231ps_fma(auVar43,auVar75,auVar61);
      auVar63 = vsubps_avx(auVar68,*(undefined1 (*) [16])(ray + 0x20));
      auVar37 = *(undefined1 (*) [16])(ray + 0x40);
      auVar33 = *(undefined1 (*) [16])(ray + 0x50);
      auVar55 = *(undefined1 (*) [16])(ray + 0x60);
      auVar86._0_4_ = auVar37._0_4_ * auVar59._0_4_;
      auVar86._4_4_ = auVar37._4_4_ * auVar59._4_4_;
      auVar86._8_4_ = auVar37._8_4_ * auVar59._8_4_;
      auVar86._12_4_ = auVar37._12_4_ * auVar59._12_4_;
      auVar36 = vfmsub231ps_fma(auVar86,auVar58,auVar33);
      auVar69._0_4_ = auVar55._0_4_ * auVar35._0_4_;
      auVar69._4_4_ = auVar55._4_4_ * auVar35._4_4_;
      auVar69._8_4_ = auVar55._8_4_ * auVar35._8_4_;
      auVar69._12_4_ = auVar55._12_4_ * auVar35._12_4_;
      auVar72 = vfmadd231ps_fma(auVar69,auVar31,auVar33);
      auVar87._0_4_ = auVar33._0_4_ * auVar63._0_4_;
      auVar87._4_4_ = auVar33._4_4_ * auVar63._4_4_;
      auVar87._8_4_ = auVar33._8_4_ * auVar63._8_4_;
      auVar87._12_4_ = auVar33._12_4_ * auVar63._12_4_;
      auVar43 = vfmsub231ps_fma(auVar87,auVar59,auVar55);
      auVar88._0_4_ = auVar55._0_4_ * auVar58._0_4_;
      auVar88._4_4_ = auVar55._4_4_ * auVar58._4_4_;
      auVar88._8_4_ = auVar55._8_4_ * auVar58._8_4_;
      auVar88._12_4_ = auVar55._12_4_ * auVar58._12_4_;
      auVar56 = vfmsub231ps_fma(auVar88,auVar63,auVar37);
      auVar72 = vfmadd231ps_fma(auVar72,auVar73,auVar37);
      auVar52._0_4_ = fVar48 * auVar36._0_4_;
      auVar52._4_4_ = fVar48 * auVar36._4_4_;
      auVar52._8_4_ = fVar48 * auVar36._8_4_;
      auVar52._12_4_ = fVar48 * auVar36._12_4_;
      auVar33 = vfmadd231ps_fma(auVar52,auVar56,auVar77);
      auVar78._8_4_ = 0x80000000;
      auVar78._0_8_ = 0x8000000080000000;
      auVar78._12_4_ = 0x80000000;
      auVar37 = vandps_avx(auVar72,auVar78);
      auVar33 = vfmadd231ps_fma(auVar33,auVar43,auVar75);
      uVar16 = auVar37._0_4_;
      auVar76._0_4_ = uVar16 ^ auVar33._0_4_;
      uVar80 = auVar37._4_4_;
      auVar76._4_4_ = uVar80 ^ auVar33._4_4_;
      uVar81 = auVar37._8_4_;
      auVar76._8_4_ = uVar81 ^ auVar33._8_4_;
      uVar82 = auVar37._12_4_;
      auVar76._12_4_ = uVar82 ^ auVar33._12_4_;
      auVar33 = vcmpps_avx(auVar76,_DAT_01f7aa10,5);
      auVar55 = auVar34 & auVar33;
      if ((((auVar55 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar55 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar55 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar55[0xf])
      {
LAB_019bf985:
        auVar6._8_8_ = uVar14;
        auVar6._0_8_ = uVar13;
      }
      else {
        auVar33 = vandps_avx(auVar33,auVar34);
        auVar54._0_4_ = auVar36._0_4_ * fVar9;
        auVar54._4_4_ = auVar36._4_4_ * fVar9;
        auVar54._8_4_ = auVar36._8_4_ * fVar9;
        auVar54._12_4_ = auVar36._12_4_ * fVar9;
        auVar55 = vfmadd132ps_fma(auVar56,auVar54,auVar61);
        auVar55 = vfmadd132ps_fma(auVar43,auVar55,auVar51);
        auVar62._0_4_ = uVar16 ^ auVar55._0_4_;
        auVar62._4_4_ = uVar80 ^ auVar55._4_4_;
        auVar62._8_4_ = uVar81 ^ auVar55._8_4_;
        auVar62._12_4_ = uVar82 ^ auVar55._12_4_;
        auVar55 = vcmpps_avx(auVar62,_DAT_01f7aa10,5);
        auVar36 = auVar33 & auVar55;
        if ((((auVar36 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (auVar36 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar36 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar36[0xf]
           ) goto LAB_019bf985;
        auVar36 = vandps_avx(auVar72,auVar83);
        auVar33 = vandps_avx(auVar33,auVar55);
        auVar55 = vsubps_avx(auVar36,auVar76);
        auVar55 = vcmpps_avx(auVar55,auVar62,5);
        auVar43 = auVar33 & auVar55;
        if ((((auVar43 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (auVar43 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar43 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar43[0xf]
           ) goto LAB_019bf985;
        auVar33 = vandps_avx(auVar55,auVar33);
        auVar70._0_4_ = auVar63._0_4_ * auVar35._0_4_;
        auVar70._4_4_ = auVar63._4_4_ * auVar35._4_4_;
        auVar70._8_4_ = auVar63._8_4_ * auVar35._8_4_;
        auVar70._12_4_ = auVar63._12_4_ * auVar35._12_4_;
        auVar55 = vfmadd213ps_fma(auVar59,auVar31,auVar70);
        auVar55 = vfmadd213ps_fma(auVar58,auVar73,auVar55);
        auVar57._0_4_ = uVar16 ^ auVar55._0_4_;
        auVar57._4_4_ = uVar80 ^ auVar55._4_4_;
        auVar57._8_4_ = uVar81 ^ auVar55._8_4_;
        auVar57._12_4_ = uVar82 ^ auVar55._12_4_;
        auVar66._0_4_ = auVar36._0_4_ * *(float *)(ray + 0x30);
        auVar66._4_4_ = auVar36._4_4_ * *(float *)(ray + 0x34);
        auVar66._8_4_ = auVar36._8_4_ * *(float *)(ray + 0x38);
        auVar66._12_4_ = auVar36._12_4_ * *(float *)(ray + 0x3c);
        auVar71._0_4_ = auVar36._0_4_ * *(float *)(ray + 0x80);
        auVar71._4_4_ = auVar36._4_4_ * *(float *)(ray + 0x84);
        auVar71._8_4_ = auVar36._8_4_ * *(float *)(ray + 0x88);
        auVar71._12_4_ = auVar36._12_4_ * *(float *)(ray + 0x8c);
        auVar55 = vcmpps_avx(auVar66,auVar57,1);
        auVar58 = vcmpps_avx(auVar57,auVar71,2);
        auVar55 = vandps_avx(auVar58,auVar55);
        auVar58 = auVar33 & auVar55;
        if ((((auVar58 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (auVar58 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar58 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar58[0xf]
           ) {
LAB_019bfde2:
          auVar6._8_8_ = uVar14;
          auVar6._0_8_ = uVar13;
        }
        else {
          auVar33 = vandps_avx(auVar55,auVar33);
          auVar55 = vcmpps_avx(auVar72,_DAT_01f7aa10,4);
          auVar58 = auVar33 & auVar55;
          if ((((auVar58 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar58 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar58 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar58[0xf]) goto LAB_019bfde2;
          auVar6 = vandps_avx(auVar55,auVar33);
          local_1928 = auVar35;
          local_1918 = auVar31;
          local_1908 = auVar73;
          local_18f8 = auVar36;
          _local_18e8 = auVar57;
          _local_18d8 = auVar62;
          _local_18c8 = auVar76;
        }
      }
      uVar80 = *(uint *)((long)&local_1888 + uVar27 * 4);
      pGVar4 = (context->scene->geometries).items[uVar80].ptr;
      uVar16 = pGVar4->mask;
      auVar32._4_4_ = uVar16;
      auVar32._0_4_ = uVar16;
      auVar32._8_4_ = uVar16;
      auVar32._12_4_ = uVar16;
      auVar33 = vpand_avx(auVar32,*(undefined1 (*) [16])(ray + 0x90));
      auVar33 = vpcmpeqd_avx(auVar33,_DAT_01f7aa10);
      auVar55 = auVar6 & ~auVar33;
      auVar85 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
      auVar37 = vpcmpeqd_avx(auVar37,auVar37);
      auVar79 = ZEXT1664(auVar37);
      if ((((auVar55 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar55 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar55 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar55[0xf] < '\0'
         ) {
        uVar18 = *(undefined4 *)((long)&local_1898 + uVar27 * 4);
        auVar33 = vandnps_avx(auVar33,auVar6);
        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
           (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          auVar55 = vrcpps_avx(local_18f8);
          auVar53._8_4_ = 0x3f800000;
          auVar53._0_8_ = 0x3f8000003f800000;
          auVar53._12_4_ = 0x3f800000;
          auVar58 = vfnmadd213ps_fma(auVar55,local_18f8,auVar53);
          auVar55 = vfmadd132ps_fma(auVar58,auVar55,auVar55);
          fVar40 = auVar55._0_4_;
          local_1738._0_4_ = fVar40 * (float)local_18c8._0_4_;
          fVar47 = auVar55._4_4_;
          local_1738._4_4_ = fVar47 * (float)local_18c8._4_4_;
          fVar48 = auVar55._8_4_;
          local_1738._8_4_ = fVar48 * fStack_18c0;
          fVar49 = auVar55._12_4_;
          local_1738._12_4_ = fVar49 * fStack_18bc;
          local_1718._4_4_ = uVar18;
          local_1718._0_4_ = uVar18;
          local_1718._8_4_ = uVar18;
          local_1718._12_4_ = uVar18;
          local_1768 = local_1908._0_8_;
          uStack_1760 = local_1908._8_8_;
          local_1758 = local_1918._0_8_;
          uStack_1750 = local_1918._8_8_;
          local_1748 = local_1928;
          local_1728 = fVar40 * (float)local_18d8._0_4_;
          fStack_1724 = fVar47 * (float)local_18d8._4_4_;
          fStack_1720 = fVar48 * fStack_18d0;
          fStack_171c = fVar49 * fStack_18cc;
          local_1708 = uVar80;
          uStack_1704 = uVar80;
          uStack_1700 = uVar80;
          uStack_16fc = uVar80;
          vpcmpeqd_avx2(ZEXT1632(local_1738),ZEXT1632(local_1738));
          uStack_16f4 = context->user->instID[0];
          auVar44._0_4_ = fVar40 * (float)local_18e8._0_4_;
          auVar44._4_4_ = fVar47 * (float)local_18e8._4_4_;
          auVar44._8_4_ = fVar48 * fStack_18e0;
          auVar44._12_4_ = fVar49 * fStack_18dc;
          local_16f8 = uStack_16f4;
          uStack_16f0 = uStack_16f4;
          uStack_16ec = uStack_16f4;
          uStack_16e8 = context->user->instPrimID[0];
          uStack_16e4 = uStack_16e8;
          uStack_16e0 = uStack_16e8;
          uStack_16dc = uStack_16e8;
          auVar55 = *(undefined1 (*) [16])(ray + 0x80);
          auVar58 = vblendvps_avx(auVar55,auVar44,auVar33);
          *(undefined1 (*) [16])(ray + 0x80) = auVar58;
          args.valid = (int *)local_19a8;
          args.geometryUserPtr = pGVar4->userPtr;
          args.context = context->user;
          args.hit = (RTCHitN *)&local_1768;
          args.N = 4;
          local_19a8 = auVar33;
          args.ray = (RTCRayN *)ray;
          if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            (*pGVar4->occlusionFilterN)(&args);
            auVar85 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          }
          if (local_19a8 == (undefined1  [16])0x0) {
            auVar33 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
            auVar37 = vpcmpeqd_avx(auVar37,auVar37);
            auVar79 = ZEXT1664(auVar37);
            auVar37 = auVar37 ^ auVar33;
          }
          else {
            p_Var5 = context->args->filter;
            auVar37 = vpcmpeqd_avx(auVar37,auVar37);
            auVar79 = ZEXT1664(auVar37);
            if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var5)(&args);
              auVar37 = vpcmpeqd_avx(auVar37,auVar37);
              auVar79 = ZEXT1664(auVar37);
              auVar85 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
            }
            auVar33 = vpcmpeqd_avx(local_19a8,_DAT_01f7aa10);
            auVar37 = auVar79._0_16_ ^ auVar33;
            auVar45._8_4_ = 0xff800000;
            auVar45._0_8_ = 0xff800000ff800000;
            auVar45._12_4_ = 0xff800000;
            auVar33 = vblendvps_avx(auVar45,*(undefined1 (*) [16])(args.ray + 0x80),auVar33);
            *(undefined1 (*) [16])(args.ray + 0x80) = auVar33;
          }
          auVar37 = vpslld_avx(auVar37,0x1f);
          auVar33 = vpsrad_avx(auVar37,0x1f);
          auVar37 = vblendvps_avx(auVar55,*(undefined1 (*) [16])pRVar1,auVar37);
          *(undefined1 (*) [16])pRVar1 = auVar37;
        }
        auVar34 = vpandn_avx(auVar33,auVar34);
      }
      if (((((auVar34 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
            (auVar34 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar34 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar34[0xf])
         || (bVar30 = 2 < uVar27, uVar27 = uVar27 + 1, bVar30)) break;
    }
    auVar37 = vandps_avx(auVar34,auVar41);
    auVar41 = auVar41 & auVar34;
    if ((((auVar41 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar41 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar41 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar41[0xf])
    break;
  }
  terminated.field_0.i[0] = auVar79._0_4_ ^ auVar37._0_4_;
  terminated.field_0.i[1] = auVar79._4_4_ ^ auVar37._4_4_;
  terminated.field_0.i[2] = auVar79._8_4_ ^ auVar37._8_4_;
  terminated.field_0.i[3] = auVar79._12_4_ ^ auVar37._12_4_;
LAB_019bfe1c:
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       vorps_avx((undefined1  [16])vVar15.field_0,(undefined1  [16])terminated.field_0);
  auVar34 = auVar79._0_16_ & ~(undefined1  [16])terminated.field_0;
  if ((((auVar34 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar34 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar34 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar34[0xf])
  goto LAB_019bff18;
  auVar46._8_4_ = 0xff800000;
  auVar46._0_8_ = 0xff800000ff800000;
  auVar46._12_4_ = 0xff800000;
  tray.tfar.field_0 =
       (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
       vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar46,
                     (undefined1  [16])terminated.field_0);
  goto LAB_019bf5b3;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }